

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall argo::lexer::read_token(lexer *this)

{
  exception_type et;
  uint uVar1;
  json_parser_exception *this_00;
  size_t byte_index;
  token local_40;
  
  consume_white_space(this);
  uVar1 = (*this->m_reader->_vptr_reader[2])();
  if (uVar1 - 0x30 < 10) {
    (*this->m_reader->_vptr_reader[3])(this->m_reader,(ulong)uVar1);
LAB_00112f01:
    read_number(this);
    return;
  }
  if (uVar1 == 0x22) {
    read_string(this);
    return;
  }
  if (uVar1 == 0x2c) {
    token::token(&local_40,value_separator_e);
    token::operator=(&this->m_token,&local_40);
  }
  else {
    if (uVar1 == 0x2d) {
      (*this->m_reader->_vptr_reader[3])(this->m_reader,0x2d);
      goto LAB_00112f01;
    }
    if (uVar1 == 0x3a) {
      token::token(&local_40,name_separator_e);
      token::operator=(&this->m_token,&local_40);
    }
    else if (uVar1 == 0x5b) {
      token::token(&local_40,begin_array_e);
      token::operator=(&this->m_token,&local_40);
    }
    else if (uVar1 == 0x5d) {
      token::token(&local_40,end_array_e);
      token::operator=(&this->m_token,&local_40);
    }
    else {
      if (uVar1 == 0x66) {
        read_false(this);
        return;
      }
      if (uVar1 == 0x6e) {
        read_null(this);
        return;
      }
      if (uVar1 == 0x74) {
        read_true(this);
        return;
      }
      if (uVar1 == 0x7b) {
        token::token(&local_40,begin_object_e);
        token::operator=(&this->m_token,&local_40);
      }
      else {
        if (uVar1 != 0x7d) {
          if (uVar1 == 0xffffffff) {
            this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
            byte_index = reader::get_byte_index(this->m_reader);
            et = unexpected_eof_e;
          }
          else {
            this_00 = (json_parser_exception *)__cxa_allocate_exception(0xe0);
            byte_index = reader::get_byte_index(this->m_reader);
            et = invalid_character_e;
          }
          json_parser_exception::json_parser_exception(this_00,et,byte_index);
          __cxa_throw(this_00,&json_parser_exception::typeinfo,std::exception::~exception);
        }
        token::token(&local_40,end_object_e);
        token::operator=(&this->m_token,&local_40);
      }
    }
  }
  token::~token(&local_40);
  return;
}

Assistant:

void lexer::read_token()
{
    consume_white_space();
    int c = m_reader.next();

    if (isdigit(c))
    {
        m_reader.put_back(c);
        read_number();
    }
    else
    {
        switch (c)
        {
        case '[':
            m_token = token(token::begin_array_e);
            break;
        case ']':
            m_token = token(token::end_array_e);
            break;
        case '{':
            m_token = token(token::begin_object_e);
            break;
        case '}':
            m_token = token(token::end_object_e);
            break;
        case ':':
            m_token = token(token::name_separator_e);
            break;
        case ',':
            m_token = token(token::value_separator_e);
            break;
        case '-':
            m_reader.put_back(c);
            read_number();
            break;
        case '"':
            read_string();
            break;
        case 'f':
            read_false();
            break;
        case 't':
            read_true();
            break;
        case 'n':
            read_null();
            break;
        case EOF:
            throw json_parser_exception(json_parser_exception::unexpected_eof_e, m_reader.get_byte_index());
        default:
            throw json_parser_exception(json_parser_exception::invalid_character_e, m_reader.get_byte_index());
        }
    }
}